

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer(int32_t i,Nonnull<char_*> buffer)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  uint32_t u;
  ulong uVar5;
  long lVar6;
  
  if (i < 0) {
    *buffer = '-';
    buffer = buffer + 1;
    i = -i;
  }
  if ((uint)i < 10) {
    *buffer = (byte)i | 0x30;
    pbVar4 = (byte *)((long)buffer + 1);
  }
  else if ((uint)i < 100000000) {
    uVar5 = (ulong)((uint)i % 10000) << 0x20 | (ulong)(uint)i / 10000;
    lVar6 = (uVar5 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar5 * 0x10000;
    uVar5 = ((ulong)(lVar6 * 0x67) >> 10 & 0xf000f000f000f) * -0x9ff + lVar6 * 0x100;
    if (uVar5 == 0) {
      __assert_fail("bottom != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0xf5,
                    "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                   );
    }
    uVar1 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    *(ulong *)buffer = uVar5 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
    pbVar4 = (byte *)((long)buffer + (8 - (uVar1 >> 3 & 0x1fffffff)));
  }
  else {
    uVar5 = (ulong)(((uint)i % 100000000) % 10000) << 0x20 | (ulong)((uint)i % 100000000) / 10000;
    lVar6 = (uVar5 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar5 * 0x10000;
    uVar5 = (ulong)(lVar6 * 0x67) >> 10 & 0xf000f000f000f;
    iVar2 = (uint)i / 100000000 - 10;
    iVar3 = iVar2 >> 8;
    *(short *)buffer =
         (short)(((uint)i / 100000000) * 0x100 + ((uint)i / 1000000000) * -0x9ff + 0x3030 >>
                ((byte)((uint)iVar2 >> 8) & 8));
    pbVar4 = (byte *)((long)buffer + (long)iVar3 + 10);
    *(ulong *)((long)buffer + (long)iVar3 + 2) =
         (uVar5 | 0x3030303030303030) + (uVar5 * 0xfffffffffffff6 + lVar6) * 0x100;
  }
  *pbVar4 = 0;
  return (Nonnull<char_*>)pbVar4;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int32_t i, absl::Nonnull<char*> buffer) {
  uint32_t u = static_cast<uint32_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU32(u, buffer);
  *buffer = '\0';
  return buffer;
}